

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O0

_Bool handle_g_context_store_item(menu_conflict *menu,ui_event *event,wchar_t oid)

{
  undefined1 local_3c [8];
  ui_event out_event;
  ui_event mod_event;
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict *menu_local;
  
  if ((event->type == EVT_KBRD) && ((event->key).code == 0x67)) {
    mod_event.type = *(undefined4 *)&(event->key).mods;
    out_event.key.code = (event->mouse).type;
    out_event._8_4_ = 0x70;
    mod_event.key.code = oid;
    unique0x1000005d = event;
    event_local = (ui_event *)menu;
    menu_local._7_1_ =
         menu_handle_keypress(menu,(ui_event *)&out_event.mouse.x,(ui_event *)local_3c);
  }
  else {
    menu_local._7_1_ = false;
  }
  return menu_local._7_1_;
}

Assistant:

static bool handle_g_context_store_item(struct menu *menu,
		const ui_event *event, int oid)
{
	if (event->type == EVT_KBRD && event->key.code == 'g') {
		ui_event mod_event, out_event;

		mod_event = *event;
		mod_event.key.code = 'p';
		return menu_handle_keypress(menu, &mod_event, &out_event);
	}
	return false;
}